

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom_loader.c
# Opt level: O2

_Bool load_rom(char *rom_filename,_Bool debug_enabled)

{
  uint16_t address_00;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  int iVar17;
  FILE *pFVar18;
  size_t __size;
  uint8_t *rom_data;
  size_t sVar19;
  iNES_1_0_header header;
  char *__s;
  uint32_t address;
  uint uVar20;
  
  pFVar18 = fopen(rom_filename,"rb");
  printf("Opening rom %s for loading\n");
  if (rom_filename == (char *)0x0) {
    printf("ERROR: Failed to open rom file %s\n");
  }
  if (pFVar18 != (FILE *)0x0) {
    iVar17 = fseek(pFVar18,0,2);
    if (iVar17 == 0) {
      __size = ftell(pFVar18);
      if (__size == 0xffffffffffffffff) {
        __s = "ERROR: ftell failed to get the size of the rom image";
      }
      else {
        iVar17 = fseek(pFVar18,0,0);
        if (iVar17 == 0) {
          rom_data = (uint8_t *)malloc(__size);
          if (rom_data != (uint8_t *)0x0) {
            sVar19 = fread(rom_data,1,__size,pFVar18);
            fclose(pFVar18);
            if (sVar19 != __size) {
              printf("ERROR: Only read %u bytes when expecting %u bytes.\n",sVar19 & 0xffffffff,
                     __size & 0xffffffff);
              return true;
            }
            parse_iNes_1_0_header(rom_data);
            parse_PRG_rom(rom_data);
            parse_CHR_rom(rom_data);
            free(rom_data);
            header = get_iNes_1_0_header();
            print_iNes_1_0_header(header);
            if ((ulong)header >> 0x38 != 0) {
              printf("ERROR: Mapper %u does not match any supported mappers\n",(ulong)header >> 0x38
                    );
              return true;
            }
            init_NROM();
            if (!debug_enabled) {
              return false;
            }
            pFVar18 = fopen("rom_data.log","w");
            if (pFVar18 != (FILE *)0x0) {
              for (uVar20 = 0x8000; uVar20 < 0x10000; uVar20 = uVar20 + 0x10) {
                address_00 = (uint16_t)uVar20;
                bVar1 = debug_read_RAM(address_00);
                bVar2 = debug_read_RAM(address_00 + 1);
                bVar3 = debug_read_RAM(address_00 + 2);
                bVar4 = debug_read_RAM(address_00 + 3);
                bVar5 = debug_read_RAM(address_00 + 4);
                bVar6 = debug_read_RAM(address_00 + 5);
                bVar7 = debug_read_RAM(address_00 + 6);
                bVar8 = debug_read_RAM(address_00 + 7);
                bVar9 = debug_read_RAM(address_00 + 8);
                bVar10 = debug_read_RAM(address_00 + 9);
                bVar11 = debug_read_RAM(address_00 + 10);
                bVar12 = debug_read_RAM(address_00 + 0xb);
                bVar13 = debug_read_RAM(address_00 + 0xc);
                bVar14 = debug_read_RAM(address_00 + 0xd);
                bVar15 = debug_read_RAM(address_00 + 0xe);
                bVar16 = debug_read_RAM(address_00 + 0xf);
                fprintf(pFVar18,
                        "0x%04X: %02X %02X %02X %02X %02X %02X %02X %02X %02X %02X %02X %02X %02X %02X %02X %02X\n"
                        ,(ulong)uVar20,(ulong)bVar1,(ulong)bVar2,(ulong)bVar3,(ulong)bVar4,
                        (ulong)bVar5,(ulong)bVar6,(ulong)bVar7,(ulong)bVar8,(ulong)bVar9,
                        (ulong)bVar10,(ulong)bVar11,(ulong)bVar12,(ulong)bVar13,(ulong)bVar14,
                        (ulong)bVar15,(ulong)bVar16);
              }
              fclose(pFVar18);
              return false;
            }
            puts("ERROR: rom_data.log failed to open");
            exit(1);
          }
          __s = "ERROR: Failed to malloc memory block for rom data";
        }
        else {
          __s = "ERROR: Failed to move to START of file";
        }
      }
    }
    else {
      __s = "ERROR: Failed to move to END of file";
    }
    puts(__s);
  }
  return true;
}

Assistant:

bool load_rom(const char* rom_filename, bool debug_enabled) {
    if(read_rom(rom_filename)) {
        return true;
    }

    iNES_1_0_header parsed_header = get_iNes_1_0_header();
    print_iNes_1_0_header(parsed_header);
    switch(parsed_header.mapper) {
        case 0:
            init_NROM();
            break;
        default:
            printf("ERROR: Mapper %u does not match any supported mappers\n", parsed_header.mapper);
            return true;
    }

    if(debug_enabled) {
        print_rom_data();
    }
    return false;
}